

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-heavy-traffic-deadlock-bug.c
# Opt level: O0

int ipc_helper_heavy_traffic_deadlock_bug(void)

{
  int iVar1;
  uv_os_fd_t uVar2;
  undefined8 uVar3;
  uv_loop_t *loop;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 local_f8 [4];
  int r;
  uv_pipe_t pipe;
  
  uVar3 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar3,local_f8,1);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc-heavy-traffic-deadlock-bug.c"
            ,0x95,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  uVar2 = uv_convert_fd_to_handle(0);
  iVar1 = uv_pipe_open(local_f8,uVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc-heavy-traffic-deadlock-bug.c"
            ,0x97,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  notify_parent_process();
  do_writes_and_reads((uv_stream_t *)local_f8);
  uv_sleep(100);
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar3 = uv_default_loop();
  iVar1 = uv_loop_close(uVar3);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc-heavy-traffic-deadlock-bug.c"
            ,0x9d,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

int ipc_helper_heavy_traffic_deadlock_bug(void) {
  uv_pipe_t pipe;
  int r;

  r = uv_pipe_init(uv_default_loop(), &pipe, 1);
  ASSERT_OK(r);
  r = uv_pipe_open(&pipe, uv_convert_fd_to_handle(0));
  ASSERT_OK(r);

  notify_parent_process();
  do_writes_and_reads((uv_stream_t*) &pipe);
  uv_sleep(100);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}